

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_spawns.cxx
# Opt level: O2

void __thiscall level_tools::reconstruct_spawns(level_tools *this)

{
  uint16_t uVar1;
  xr_level_spawn *pxVar2;
  cse_abstract *pcVar3;
  xr_level_game *pxVar4;
  pointer ppmVar5;
  mp_rpoint *pmVar6;
  xr_level_env_mod *pxVar7;
  pointer ppeVar8;
  env_mod_data *peVar9;
  int iVar10;
  rgba32 rVar11;
  xr_custom_object_vec *this_00;
  xr_spawn_object *pxVar12;
  undefined4 extraout_var;
  xr_shape_object *this_01;
  undefined4 extraout_var_00;
  shape_def_vec *__x;
  xr_level *pxVar13;
  uint16_t uVar14;
  pointer ppcVar15;
  pointer ppmVar16;
  pointer ppeVar17;
  xr_name_gen name;
  xr_spawn_object *local_50;
  xr_scene_spawns *local_48;
  pointer local_40;
  pointer local_38;
  
  local_48 = xray_re::xr_scene::spawns(this->m_scene);
  this_00 = &(local_48->super_xr_scene_objects).m_objects;
  pxVar13 = this->m_level;
  if (pxVar13->m_spawn != (xr_level_spawn *)0x0) {
    xray_re::msg("building %s (%s)","spawn.part","entities");
    pxVar2 = this->m_level->m_spawn;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_00,(long)(pxVar2->m_spawns).
                             super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pxVar2->m_spawns).
                             super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
    local_40 = (pxVar2->m_spawns).
               super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar15 = (pxVar2->m_spawns).
                    super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppcVar15 != local_40;
        ppcVar15 = ppcVar15 + 1) {
      pcVar3 = *ppcVar15;
      if (pcVar3 == (cse_abstract *)0x0) {
        __assert_fail("entity",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_spawns.cxx"
                      ,0x1b,"void level_tools::reconstruct_spawns()");
      }
      *ppcVar15 = (cse_abstract *)0x0;
      pxVar12 = (xr_spawn_object *)operator_new(0x98);
      xray_re::xr_spawn_object::xr_spawn_object(pxVar12,this->m_scene,(char *)0x0);
      std::__cxx11::string::_M_assign((string *)&(pxVar12->super_xr_custom_object).m_name);
      (pxVar12->super_xr_custom_object).m_position.field_0.field_0.z =
           (pcVar3->m_o_position).field_0.field_0.z;
      *(undefined8 *)&(pxVar12->super_xr_custom_object).m_position.field_0 =
           *(undefined8 *)&(pcVar3->m_o_position).field_0;
      (pxVar12->super_xr_custom_object).m_rotation.field_0.field_0.z =
           (pcVar3->m_o_angle).field_0.field_0.z;
      *(undefined8 *)&(pxVar12->super_xr_custom_object).m_rotation.field_0 =
           *(undefined8 *)&(pcVar3->m_o_angle).field_0;
      uVar1 = this->m_spawn_version;
      if (uVar1 == 0x76) {
        uVar14 = 6;
LAB_00133974:
        pcVar3->m_version = uVar1;
        pcVar3->m_script_version = uVar14;
      }
      else {
        if (uVar1 == 0x7c) {
          uVar14 = 8;
          goto LAB_00133974;
        }
        if (uVar1 == 0x80) {
          uVar14 = 0xc;
          goto LAB_00133974;
        }
      }
      (pxVar12->field_1).m_entity = pcVar3;
      iVar10 = (*pcVar3->_vptr_cse_abstract[7])(pcVar3);
      if (CONCAT44(extraout_var,iVar10) != 0) {
        local_38 = ppcVar15;
        this_01 = (xr_shape_object *)operator_new(0x88);
        xray_re::xr_shape_object::xr_shape_object(this_01,this->m_scene);
        std::__cxx11::string::assign((char *)&(this_01->super_xr_custom_object).m_name);
        (this_01->super_xr_custom_object).m_position.field_0.field_0.z =
             (pcVar3->m_o_position).field_0.field_0.z;
        *(undefined8 *)&(this_01->super_xr_custom_object).m_position.field_0 =
             *(undefined8 *)&(pcVar3->m_o_position).field_0;
        *(undefined8 *)&(this_01->super_xr_custom_object).m_rotation.field_0 =
             *(undefined8 *)&(pcVar3->m_o_angle).field_0;
        (this_01->super_xr_custom_object).m_rotation.field_0.field_0.z =
             (pcVar3->m_o_angle).field_0.field_0.z;
        iVar10 = (*pcVar3->_vptr_cse_abstract[7])(pcVar3);
        __x = xray_re::cse_shape::shapes((cse_shape *)CONCAT44(extraout_var_00,iVar10));
        std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::operator=
                  (&this_01->m_shapes,__x);
        pxVar12->m_attached_object = (xr_custom_object *)this_01;
        ppcVar15 = local_38;
      }
      name.m_name = (char *)pxVar12;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_00,(xr_custom_object **)&name);
    }
    xray_re::xr_level::clear_spawn(this->m_level);
    pxVar13 = this->m_level;
  }
  pxVar4 = pxVar13->m_game;
  if ((pxVar4 != (xr_level_game *)0x0) &&
     ((pxVar4->m_rpoints).
      super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pxVar4->m_rpoints).
      super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    xray_re::msg("building %s (%s)","spawn.part","$rpoints");
    pxVar4 = this->m_level->m_game;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_00,((long)(pxVar4->m_rpoints).
                              super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pxVar4->m_rpoints).
                              super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) +
                       ((long)(local_48->super_xr_scene_objects).m_objects.
                              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_48->super_xr_scene_objects).m_objects.
                              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3));
    xray_re::xr_name_gen::init(&name,(EVP_PKEY_CTX *)"$rpoint");
    ppmVar5 = (pxVar4->m_rpoints).
              super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppmVar16 = (pxVar4->m_rpoints).
                    super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppmVar16 != ppmVar5;
        ppmVar16 = ppmVar16 + 1) {
      pmVar6 = *ppmVar16;
      pxVar12 = (xr_spawn_object *)operator_new(0x98);
      xray_re::xr_spawn_object::xr_spawn_object(pxVar12,this->m_scene,"$rpoint");
      std::__cxx11::string::assign((char *)&(pxVar12->super_xr_custom_object).m_name);
      (pxVar12->super_xr_custom_object).m_position.field_0.field_0.x = (pmVar6->p).field_0.field_0.x
      ;
      (pxVar12->super_xr_custom_object).m_position.field_0.field_0.y = (pmVar6->p).field_0.field_0.y
      ;
      (pxVar12->super_xr_custom_object).m_position.field_0.field_0.z = (pmVar6->p).field_0.field_0.z
      ;
      (pxVar12->super_xr_custom_object).m_rotation.field_0.field_0.x = (pmVar6->a).field_0.field_0.x
      ;
      (pxVar12->super_xr_custom_object).m_rotation.field_0.field_0.y = (pmVar6->a).field_0.field_0.y
      ;
      (pxVar12->super_xr_custom_object).m_rotation.field_0.field_0.z = (pmVar6->a).field_0.field_0.z
      ;
      (pxVar12->field_1).field_0.m_team = pmVar6->team;
      (pxVar12->field_1).field_0.m_respawn = pmVar6->respawn;
      (pxVar12->field_1).field_0.m_game = pmVar6->game;
      local_50 = pxVar12;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_00,(xr_custom_object **)&local_50);
      xray_re::xr_name_gen::next(&name);
    }
    xray_re::xr_name_gen::~xr_name_gen(&name);
    pxVar13 = this->m_level;
  }
  pxVar7 = pxVar13->m_env_mod;
  if ((pxVar7 != (xr_level_env_mod *)0x0) &&
     ((pxVar7->m_env_mods).
      super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pxVar7->m_env_mods).
      super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    xray_re::msg("building %s (%s)","spawn.part","$env_mods");
    pxVar7 = this->m_level->m_env_mod;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_00,((long)(pxVar7->m_env_mods).
                              super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pxVar7->m_env_mods).
                              super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) +
                       ((long)(local_48->super_xr_scene_objects).m_objects.
                              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_48->super_xr_scene_objects).m_objects.
                              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3));
    xray_re::xr_name_gen::init(&name,(EVP_PKEY_CTX *)"$env_mod");
    ppeVar8 = (pxVar7->m_env_mods).
              super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppeVar17 = (pxVar7->m_env_mods).
                    super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppeVar17 != ppeVar8;
        ppeVar17 = ppeVar17 + 1) {
      peVar9 = *ppeVar17;
      pxVar12 = (xr_spawn_object *)operator_new(0x98);
      xray_re::xr_spawn_object::xr_spawn_object(pxVar12,this->m_scene,"$env_mod");
      std::__cxx11::string::assign((char *)&(pxVar12->super_xr_custom_object).m_name);
      (pxVar12->super_xr_custom_object).m_position.field_0.field_0.z =
           (peVar9->position).field_0.field_0.z;
      *(undefined8 *)&(pxVar12->super_xr_custom_object).m_position.field_0 =
           *(undefined8 *)&(peVar9->position).field_0;
      (pxVar12->field_1).field_1.m_radius = peVar9->radius;
      (pxVar12->field_1).field_1.m_power = peVar9->power;
      (pxVar12->field_1).field_1.m_view_distance = peVar9->far_plane;
      rVar11 = to_rgba32(&peVar9->fog_color);
      (pxVar12->field_1).field_1.m_fog_color = rVar11;
      (pxVar12->field_1).field_1.m_fog_density = peVar9->fog_density;
      rVar11 = to_rgba32(&peVar9->ambient_color);
      (pxVar12->field_1).field_1.m_ambient_color = rVar11;
      rVar11 = to_rgba32(&peVar9->sky_color);
      (pxVar12->field_1).field_1.m_sky_color = rVar11;
      rVar11 = to_rgba32(&peVar9->hemi_color);
      (pxVar12->field_1).field_1.m_hemi_color = rVar11;
      local_50 = pxVar12;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_00,(xr_custom_object **)&local_50);
      xray_re::xr_name_gen::next(&name);
    }
    xray_re::xr_level::clear_env_mod(this->m_level);
    xray_re::xr_name_gen::~xr_name_gen(&name);
  }
  return;
}

Assistant:

void level_tools::reconstruct_spawns()
{
	xr_custom_object_vec& cobjects = m_scene->spawns()->objects();
	if (m_level->spawn()) {
		msg("building %s (%s)", "spawn.part", "entities");

		xr_entity_vec& spawns = m_level->spawn()->spawns();
		cobjects.reserve(spawns.size());

		for (xr_entity_vec_it it = spawns.begin(), end = spawns.end(); it != end; ++it) {
			cse_abstract* entity = *it;
			xr_assert(entity);
			// borrow it as usual with spawns
			*it = 0;
			xr_spawn_object* new_spawn = new xr_spawn_object(*m_scene, 0);
			new_spawn->co_name() = entity->name_replace();
			new_spawn->co_position()= entity->position();
			new_spawn->co_rotation() = entity->rotation();
			if (m_spawn_version == CSE_VERSION_SOC)
			{
			entity->version() = CSE_VERSION_SOC;
			entity->script_version() = 6;
			}
			else if (m_spawn_version == CSE_VERSION_CS)
			{
				entity->version() = CSE_VERSION_CS;
				entity->script_version() = 8;
			}
			else if (m_spawn_version == CSE_VERSION_COP)
			{
				entity->version() = CSE_VERSION_COP;
				entity->script_version() = 12;
			}

			new_spawn->entity() = entity;
			if (entity->shape()) {
				xr_shape_object* new_shape = new xr_shape_object(*m_scene);
				new_shape->co_name() = "shape";
				new_shape->co_position()= entity->position();
				new_shape->co_rotation() = entity->rotation();
				new_shape->shapes() = entity->shape()->shapes();
				new_spawn->attached_object() = new_shape;
			}
			cobjects.push_back(new_spawn);
		}
		m_level->clear_spawn();
	}
	if (m_level->game() && !m_level->game()->rpoints().empty()) {
		msg("building %s (%s)", "spawn.part", "$rpoints");

		const mp_rpoint_vec& rpoints = m_level->game()->rpoints();
		cobjects.reserve(cobjects.size() + rpoints.size());

		xr_name_gen name("$rpoint");
		for (mp_rpoint_vec_cit it = rpoints.begin(), end = rpoints.end(); it != end; ++it, name.next()) {
			const mp_rpoint* rpoint = *it;
			xr_spawn_object* new_rpoint = new xr_spawn_object(*m_scene, "$rpoint");
			new_rpoint->co_name() = name.get();
			new_rpoint->co_position().set(rpoint->p);
			new_rpoint->co_rotation().set(rpoint->a);
			new_rpoint->team() = rpoint->team;
			new_rpoint->respawn() = rpoint->respawn;
			new_rpoint->game() = rpoint->game;
			cobjects.push_back(new_rpoint);
		}
	}
	if (m_level->env_mod() && !m_level->env_mod()->env_mods().empty()) {
		msg("building %s (%s)", "spawn.part", "$env_mods");

		const env_mod_data_vec& env_mods = m_level->env_mod()->env_mods();
		cobjects.reserve(cobjects.size() + env_mods.size());

		xr_name_gen name("$env_mod");
		for (env_mod_data_vec_cit it = env_mods.begin(), end = env_mods.end();
				it != end; ++it, name.next()) {
			const env_mod_data* env_mod = *it;
			xr_spawn_object* new_env_mod = new xr_spawn_object(*m_scene, "$env_mod");
			new_env_mod->co_name() = name.get();
			new_env_mod->co_position() = env_mod->position;
			new_env_mod->radius() = env_mod->radius;
			new_env_mod->power() = env_mod->power;
			new_env_mod->view_distance() = env_mod->far_plane;
			new_env_mod->fog_color() = to_rgba32(env_mod->fog_color);
			new_env_mod->fog_density() = env_mod->fog_density;
			new_env_mod->ambient_color() = to_rgba32(env_mod->ambient_color);
			new_env_mod->sky_color() = to_rgba32(env_mod->sky_color);
			new_env_mod->hemi_color() = to_rgba32(env_mod->hemi_color);
			cobjects.push_back(new_env_mod);
		}
		m_level->clear_env_mod();
	}
}